

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObservationModelDiscrete.cpp
# Opt level: O0

Index __thiscall
ObservationModelDiscrete::SampleJointObservation
          (ObservationModelDiscrete *this,Index sI,Index jaI,Index sucI)

{
  int iVar1;
  undefined4 in_ECX;
  undefined4 in_EDX;
  undefined4 in_ESI;
  long *in_RDI;
  double dVar2;
  int i;
  Index jo;
  double sum;
  double randNr;
  Index local_30;
  double local_28;
  
  iVar1 = rand();
  local_28 = 0.0;
  local_30 = 0;
  while( true ) {
    if ((int)in_RDI[2] <= (int)local_30) {
      return 0;
    }
    dVar2 = (double)(**(code **)(*in_RDI + 0x28))(in_RDI,in_ESI,in_EDX,in_ECX,local_30);
    local_28 = dVar2 + local_28;
    if ((double)iVar1 / 2147483648.0 <= local_28) break;
    local_30 = local_30 + 1;
  }
  return local_30;
}

Assistant:

Index ObservationModelDiscrete::SampleJointObservation(Index sI, Index jaI, Index sucI)
{
    double randNr=rand() / (RAND_MAX + 1.0);

    double sum=0;
    Index jo=0;
    int i;
    
    for(i=0;i<_m_nrJointObservations;i++)
    {
        sum+=Get(sI,jaI,sucI,i);
        if(randNr<=sum)
        {
            jo=i;
            break;
        }
    }
    
    return(jo);
}